

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shanten.cpp
# Opt level: O0

int mahjong::knitted_straight_shanten
              (tile_t *standing_tiles,intptr_t standing_cnt,useful_table_t *useful_table)

{
  int iVar1;
  bool *pbVar2;
  bool *pbVar3;
  bool *pbVar4;
  bool *pbVar5;
  int st_1;
  int fixed_cnt_1;
  int i_1;
  int st;
  int fixed_cnt;
  int i;
  useful_table_t temp_table;
  uint16_t local_b8 [2];
  int ret;
  tile_table_t cnt_table;
  useful_table_t *useful_table_local;
  intptr_t standing_cnt_local;
  tile_t *standing_tiles_local;
  
  cnt_table._136_8_ = useful_table;
  if ((standing_tiles == (tile_t *)0x0) || ((standing_cnt != 0xd && (standing_cnt != 10)))) {
    standing_tiles_local._4_4_ = std::numeric_limits<int>::max();
  }
  else {
    map_tiles(standing_tiles,standing_cnt,(tile_table_t *)local_b8);
    temp_table._68_4_ = std::numeric_limits<int>::max();
    if (cnt_table._136_8_ == 0) {
      for (st_1 = 0; st_1 < 6; st_1 = st_1 + 1) {
        iVar1 = basic_form_shanten_specified
                          ((tile_table_t *)local_b8,standard_knitted_straight + (long)st_1 * 9,9,
                           (long)((0xd - (int)standing_cnt) / 3),(useful_table_t *)0x0);
        if (iVar1 < (int)temp_table._68_4_) {
          temp_table._68_4_ = iVar1;
        }
      }
    }
    else {
      memset((void *)cnt_table._136_8_,0,0x48);
      for (st = 0; st < 6; st = st + 1) {
        iVar1 = basic_form_shanten_specified
                          ((tile_table_t *)local_b8,standard_knitted_straight + (long)st * 9,9,
                           (long)((0xd - (int)standing_cnt) / 3),(useful_table_t *)&fixed_cnt);
        if (iVar1 < (int)temp_table._68_4_) {
          temp_table._68_4_ = iVar1;
          memcpy((void *)cnt_table._136_8_,&fixed_cnt,0x48);
        }
        else if (iVar1 == temp_table._68_4_) {
          pbVar2 = std::begin<bool,72ul>((bool (*) [72])cnt_table._136_8_);
          pbVar3 = std::end<bool,72ul>((bool (*) [72])cnt_table._136_8_);
          pbVar4 = std::begin<bool,72ul>((bool (*) [72])&fixed_cnt);
          pbVar5 = std::begin<bool,72ul>((bool (*) [72])cnt_table._136_8_);
          std::
          transform<bool*,bool*,bool*,mahjong::knitted_straight_shanten(unsigned_char_const*,long,bool(*)[72])::__0>
                    (pbVar2,pbVar3,pbVar4,pbVar5);
        }
      }
    }
    standing_tiles_local._4_1_ = temp_table[0x44];
    standing_tiles_local._5_1_ = temp_table[0x45];
    standing_tiles_local._6_1_ = temp_table[0x46];
    standing_tiles_local._7_1_ = temp_table[0x47];
  }
  return standing_tiles_local._4_4_;
}

Assistant:

int knitted_straight_shanten(const tile_t *standing_tiles, intptr_t standing_cnt, useful_table_t *useful_table) {
    if (standing_tiles == nullptr || (standing_cnt != 13 && standing_cnt != 10)) {
        return std::numeric_limits<int>::max();
    }

    // 打表
    tile_table_t cnt_table;
    map_tiles(standing_tiles, standing_cnt, &cnt_table);

    int ret = std::numeric_limits<int>::max();

    // 需要获取有效牌时，计算上听数的同时就获取有效牌了
    if (useful_table != nullptr) {
        memset(*useful_table, 0, sizeof(*useful_table));

        useful_table_t temp_table;

        // 6种组合龙分别计算
        for (int i = 0; i < 6; ++i) {
            int fixed_cnt = (13 - static_cast<int>(standing_cnt)) / 3;
            int st = basic_form_shanten_specified(cnt_table, standard_knitted_straight[i], 9, fixed_cnt, &temp_table);
            if (st < ret) {  // 上听数小的，直接覆盖数据
                ret = st;
                memcpy(*useful_table, temp_table, sizeof(*useful_table));  // 直接覆盖原来的有效牌数据
            }
            else if (st == ret) {  // 两种不同组合龙上听数如果相等的话，直接合并有效牌
                std::transform(std::begin(*useful_table), std::end(*useful_table), std::begin(temp_table),
                    std::begin(*useful_table), [](bool u, bool t) { return u || t; });
            }
        }
    }
    else {
        // 6种组合龙分别计算
        for (int i = 0; i < 6; ++i) {
            int fixed_cnt = (13 - static_cast<int>(standing_cnt)) / 3;
            int st = basic_form_shanten_specified(cnt_table, standard_knitted_straight[i], 9, fixed_cnt, nullptr);
            if (st < ret) {
                ret = st;
            }
        }
    }

    return ret;
}